

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_utils.cc
# Opt level: O2

string * __thiscall
RigidBodyDynamics::Utils::GetModelHierarchy_abi_cxx11_
          (string *__return_storage_ptr__,Utils *this,Model *model)

{
  int in_R8D;
  allocator<char> local_1b9;
  string local_1b8;
  stringstream result;
  ostream local_188 [376];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"",&local_1b9);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)&result,(string *)&local_1b8,_S_out|_S_in);
  std::__cxx11::string::~string((string *)&local_1b8);
  print_hierarchy_abi_cxx11_(&local_1b8,this,(Model *)0x0,0,in_R8D);
  std::operator<<(local_188,(string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&result);
  return __return_storage_ptr__;
}

Assistant:

RBDL_DLLAPI std::string GetModelHierarchy (const Model &model)
{
  stringstream result ("");

  result << print_hierarchy (model);

  return result.str();
}